

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

GLuint LoadShader(GLsizei count,GLchar **shaderSource,GLint *lengths,char *shaderName,
                 GLenum shaderType)

{
  int iVar1;
  char *local_38;
  char *shaderType_desc;
  GLuint shader;
  GLenum shaderType_local;
  char *shaderName_local;
  GLint *lengths_local;
  GLchar **shaderSource_local;
  GLsizei count_local;
  
  shaderSource_local._4_4_ = (*glad_glCreateShader)(shaderType);
  if (shaderSource_local._4_4_ == 0) {
    bov_error_log(0x20002,"shader \'%s\' creation failed",shaderName);
    fprintf(_stderr,"\t(in function %s, line %d)\n","LoadShader",0x9d);
    shaderSource_local._4_4_ = 0;
  }
  else {
    (*glad_glShaderSource)(shaderSource_local._4_4_,count,shaderSource,lengths);
    (*glad_glCompileShader)(shaderSource_local._4_4_);
    iVar1 = checkivError(shaderSource_local._4_4_,0x8b81,glad_glGetShaderiv,glad_glGetShaderInfoLog)
    ;
    if (iVar1 != 0) {
      local_38 = "unknown-type";
      if (shaderType == 0x8b31) {
        local_38 = "vertex";
      }
      else if (shaderType == 0x8b30) {
        local_38 = "fragment";
      }
      else if (shaderType == 0x8dd9) {
        local_38 = "geometry";
      }
      bov_error_log(0x20002,"%s shader: %s compilation failed",local_38,shaderName);
      fprintf(_stderr,"\t(in function %s, line %d)\n","LoadShader",0xaf);
      shaderSource_local._4_4_ = 0;
    }
  }
  return shaderSource_local._4_4_;
}

Assistant:

static GLuint LoadShader(GLsizei count,
                         const GLchar* shaderSource[],
                         const GLint* lengths,
                         const char* shaderName,
                         GLenum shaderType)
{
	GLuint shader = glCreateShader(shaderType);
	if(shader==0) {
		BOV_ERROR_LOG(BOV_SHADER_ERROR,
		              "shader '%s' creation failed",
		              shaderName);
		return 0;
	}

	glShaderSource(shader, count, shaderSource, lengths);
	glCompileShader(shader);

	if(checkivError(shader, GL_COMPILE_STATUS, glGetShaderiv,
	                glGetShaderInfoLog)){
		const char* shaderType_desc = "unknown-type";
		if(shaderType==GL_VERTEX_SHADER)
			shaderType_desc = "vertex";
		else if(shaderType==GL_FRAGMENT_SHADER)
			shaderType_desc = "fragment";
		else if(shaderType==GL_GEOMETRY_SHADER)
			shaderType_desc = "geometry";
		BOV_ERROR_LOG(BOV_SHADER_ERROR,
		              "%s shader: %s compilation failed",
		              shaderType_desc, shaderName);
		return 0;
	}

	return shader;
}